

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O0

void rtp_rb_print_rb(void)

{
  uint local_c;
  uint i;
  
  for (local_c = rtp_rb_start; local_c != rtp_rb_end; local_c = (local_c + 1) % rtp_rb_size) {
    if (rtp_rb[local_c].length != 0) {
      fprintf(_stderr,"%.3u: seq %.3u\n",(ulong)local_c,(ulong)((uint)rtp_rb[local_c].b >> 0x10));
    }
  }
  return;
}

Assistant:

void rtp_rb_print_rb(void) {
  unsigned int i;
  for (i = rtp_rb_start; i != rtp_rb_end; i = (i + 1) % rtp_rb_size) {
    if (rtp_rb[i].length != 0)
      fprintf(stderr, "%.3u: seq %.3u\n", i, rtp_rb[i].b.seq);
  }
}